

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O2

void tr_partition(saidx_t *ISAd,saidx_t *first,saidx_t *middle,saidx_t *last,saidx_t **pa,
                 saidx_t **pb,saidx_t v)

{
  undefined4 uVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  
  do {
    piVar2 = middle;
    piVar9 = piVar2;
    if (last <= piVar2) goto LAB_0010d5fe;
    middle = piVar2 + 1;
  } while (ISAd[*piVar2] == v);
  if (ISAd[*piVar2] < v) {
    while (piVar2 = piVar2 + 1, piVar2 < last) {
      iVar8 = *piVar2;
      if (v < ISAd[iVar8]) break;
      if (ISAd[iVar8] == v) {
        *piVar2 = *piVar9;
        *piVar9 = iVar8;
        piVar9 = piVar9 + 1;
      }
    }
  }
LAB_0010d5fe:
  piVar4 = last + -1;
  do {
    piVar3 = piVar4;
    piVar5 = piVar3;
    if (piVar3 <= piVar2) goto LAB_0010d6b6;
    piVar4 = piVar3 + -1;
  } while (ISAd[*piVar3] == v);
  piVar4 = piVar3;
  if (v < ISAd[*piVar3]) {
    while (piVar5 = piVar4 + -1, piVar2 < piVar5) {
      iVar8 = *piVar5;
      if (ISAd[iVar8] < v) break;
      piVar4 = piVar5;
      if (ISAd[iVar8] == v) {
        *piVar5 = *piVar3;
        *piVar3 = iVar8;
        piVar3 = piVar3 + -1;
      }
    }
    piVar5 = piVar4 + -1;
  }
LAB_0010d6b6:
  do {
    if (piVar5 <= piVar2) {
      if (piVar9 <= piVar3) {
        uVar10 = (ulong)((long)piVar9 - (long)first) >> 2;
        uVar11 = (ulong)((long)piVar2 - (long)piVar9) >> 2;
        if ((int)uVar10 < (int)uVar11) {
          uVar11 = uVar10;
        }
        lVar6 = 0;
        for (uVar10 = uVar11 & 0xffffffff; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
          uVar1 = *(undefined4 *)((long)first + lVar6);
          *(undefined4 *)((long)first + lVar6) =
               *(undefined4 *)((long)piVar2 + lVar6 + (long)(int)uVar11 * -4);
          *(undefined4 *)((long)piVar2 + lVar6 + (long)(int)uVar11 * -4) = uVar1;
          lVar6 = lVar6 + 4;
        }
        uVar11 = (long)piVar3 + (4 - (long)piVar2) >> 2;
        uVar7 = (int)((ulong)((long)last - (long)piVar3) >> 2) - 1;
        uVar10 = (ulong)uVar7;
        if ((int)uVar11 <= (int)uVar7) {
          uVar10 = uVar11 & 0xffffffff;
        }
        iVar8 = (int)uVar10;
        lVar6 = 0;
        for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
          uVar1 = *(undefined4 *)((long)piVar2 + lVar6);
          *(undefined4 *)((long)piVar2 + lVar6) =
               *(undefined4 *)((long)last + lVar6 + (long)iVar8 * -4);
          *(undefined4 *)((long)last + lVar6 + (long)iVar8 * -4) = uVar1;
          lVar6 = lVar6 + 4;
        }
        first = (saidx_t *)((long)first + ((long)piVar2 - (long)piVar9));
        last = last + -uVar11;
      }
      *pa = first;
      *pb = last;
      return;
    }
    iVar8 = *piVar2;
    *piVar2 = *piVar5;
    *piVar5 = iVar8;
    while (piVar2 = piVar2 + 1, piVar2 < piVar5) {
      iVar8 = *piVar2;
      if (v < ISAd[iVar8]) break;
      if (ISAd[iVar8] == v) {
        *piVar2 = *piVar9;
        *piVar9 = iVar8;
        piVar9 = piVar9 + 1;
      }
    }
LAB_0010d6a4:
    piVar5 = piVar5 + -1;
  } while (piVar5 <= piVar2);
  iVar8 = *piVar5;
  if (ISAd[iVar8] < v) goto LAB_0010d6b6;
  if (ISAd[iVar8] == v) {
    *piVar5 = *piVar3;
    *piVar3 = iVar8;
    piVar3 = piVar3 + -1;
  }
  goto LAB_0010d6a4;
}

Assistant:

static INLINE
void
tr_partition(const saidx_t *ISAd,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t **pa, saidx_t **pb, saidx_t v) {
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t t, s;
  saidx_t x = 0;

  for(b = middle - 1; (++b < last) && ((x = ISAd[*b]) == v);) { }
  if(((a = b) < last) && (x < v)) {
    for(; (++b < last) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
  }
  for(c = last; (b < --c) && ((x = ISAd[*c]) == v);) { }
  if((b < (d = c)) && (x > v)) {
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }
  for(; b < c;) {
    SWAP(*b, *c);
    for(; (++b < c) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }

  if(a <= d) {
    c = b - 1;
    if((s = a - first) > (t = b - a)) { s = t; }
    for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    if((s = d - c) > (t = last - d - 1)) { s = t; }
    for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    first += (b - a), last -= (d - c);
  }
  *pa = first, *pb = last;
}